

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O2

AABox * operator+(AABox *__return_storage_ptr__,AABox *a,AABox *b)

{
  float fVar1;
  
  fVar1 = fminf(a->x1,b->x1);
  __return_storage_ptr__->x1 = fVar1;
  fVar1 = fmaxf(a->x2,b->x2);
  __return_storage_ptr__->x2 = fVar1;
  fVar1 = fminf(a->y1,b->y1);
  __return_storage_ptr__->y1 = fVar1;
  fVar1 = fmaxf(a->y2,b->y2);
  __return_storage_ptr__->y2 = fVar1;
  fVar1 = fminf(a->z1,b->z1);
  __return_storage_ptr__->z1 = fVar1;
  fVar1 = fmaxf(a->z2,b->z2);
  __return_storage_ptr__->z2 = fVar1;
  return __return_storage_ptr__;
}

Assistant:

AABox operator+ (const AABox& a, const AABox& b) {
	AABox t;
	t.x1 = fmin(a.x1, b.x1);
	t.x2 = fmax(a.x2, b.x2);
	t.y1 = fmin(a.y1, b.y1);
	t.y2 = fmax(a.y2, b.y2);
	t.z1 = fmin(a.z1, b.z1);
	t.z2 = fmax(a.z2, b.z2);
	return t;
}